

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O2

StaticAssertion * __thiscall
soul::ASTUtilities::createStaticAssertion
          (ASTUtilities *this,Context *context,Allocator *allocator,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> args)

{
  pool_ref<soul::AST::Expression> *args_1;
  StaticAssertion *pSVar1;
  size_t numArgs;
  anon_class_24_3_c18e7d5a getError;
  allocator<char> local_b9;
  size_t local_b8;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string_view local_80;
  anon_class_24_3_c18e7d5a local_70;
  CompileMessage local_58;
  
  local_b0.e = args.s;
  local_b8 = (long)local_b0.e - (long)allocator >> 3;
  local_b0.s = (pool_ref<soul::AST::Expression> *)allocator;
  if (0xfffffffffffffffd < local_b8 - 3) {
    local_70.numArgs = &local_b8;
    local_70.args = &local_b0;
    local_70.allocator = (Allocator *)context;
    args_1 = ArrayView<soul::pool_ref<soul::AST::Expression>_>::front(local_70.args);
    local_80 = createStaticAssertion::anon_class_24_3_c18e7d5a::operator()(&local_70);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_a0,&local_80,&local_b9);
    pSVar1 = PoolAllocator::
             allocate<soul::AST::StaticAssertion,soul::AST::Context_const&,soul::pool_ref<soul::AST::Expression>&,std::__cxx11::string>
                       ((PoolAllocator *)context,(Context *)this,args_1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    return pSVar1;
  }
  Errors::expected1or2Args<>();
  AST::Context::throwError((Context *)this,&local_58,false);
}

Assistant:

static AST::StaticAssertion& createStaticAssertion (const AST::Context& context, AST::Allocator& allocator,
                                                        ArrayView<pool_ref<AST::Expression>> args)
    {
        auto numArgs = args.size();

        if (numArgs != 1 && numArgs != 2)
            context.throwError (Errors::expected1or2Args());

        auto getError = [&] () -> std::string_view
        {
            if (numArgs == 2)
            {
                auto& e = args[1].get();

                if (AST::isResolvedAsConstant (e))
                    if (auto c = e.getAsConstant())
                        if (c->value.getType().isStringLiteral())
                            return allocator.stringDictionary.getStringForHandle (c->value.getStringLiteral());

                e.context.throwError (Errors::expectedStringLiteralAsArg2());
            }

            return {};
        };

        return allocator.allocate<AST::StaticAssertion> (context, args.front(), std::string (getError()));
    }